

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib591.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  int maxfd;
  int running;
  long timeout;
  timeval interval;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  int local_1e0;
  int local_1dc;
  long local_1d8;
  timeval local_1d0;
  undefined8 local_1c0;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  __stream = fopen64(libtest_arg3,"rb");
  uVar1 = _stderr;
  if (__stream == (FILE *)0x0) {
    piVar8 = __errno_location();
    iVar2 = *piVar8;
    pcVar9 = strerror(iVar2);
    curl_mfprintf(uVar1,"fopen() failed with error: %d (%s)\n",iVar2,pcVar9);
    curl_mfprintf(_stderr,"Error opening file: (%s)\n",libtest_arg3);
    iVar2 = 0x75;
    goto LAB_001024c1;
  }
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar4 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                  ,0x38,iVar2,uVar4);
  }
  if (iVar2 == 0) {
    lVar5 = curl_easy_init();
    iVar2 = 0;
    if (lVar5 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                    ,0x3e);
      iVar2 = 0x7c;
    }
    lVar6 = 0;
    if (lVar5 != 0) {
      iVar3 = curl_easy_setopt(lVar5,0x29,1);
      uVar1 = _stderr;
      iVar2 = 0;
      if (iVar3 != 0) {
        uVar4 = curl_easy_strerror(iVar3);
        curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                      ,0x41,iVar3,uVar4);
        iVar2 = iVar3;
      }
      if (iVar2 == 0) {
        iVar3 = curl_easy_setopt(lVar5,0x2712,URL);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                        ,0x44,iVar3,uVar4);
          iVar2 = iVar3;
        }
        lVar6 = 0;
        if (iVar2 != 0) goto LAB_001024a4;
        iVar3 = curl_easy_setopt(lVar5,0x2e,1);
        uVar1 = _stderr;
        iVar2 = 0;
        if (iVar3 != 0) {
          uVar4 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                        ,0x47,iVar3,uVar4);
          iVar2 = iVar3;
        }
        if (iVar2 == 0) {
          iVar3 = curl_easy_setopt(lVar5,0x2719,__stream);
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                          ,0x4a,iVar3,uVar4);
            iVar2 = iVar3;
          }
          lVar6 = 0;
          if (iVar2 != 0) goto LAB_001024a4;
          iVar3 = curl_easy_setopt(lVar5,0x2721,"-");
          uVar1 = _stderr;
          iVar2 = 0;
          if (iVar3 != 0) {
            uVar4 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                          ,0x4d,iVar3,uVar4);
            iVar2 = iVar3;
          }
          if (iVar2 == 0) {
            lVar6 = strtol(libtest_arg2,(char **)0x0,10);
            iVar3 = curl_easy_setopt(lVar5,0xd4,lVar6 * 1000);
            uVar1 = _stderr;
            iVar2 = 0;
            if (iVar3 != 0) {
              uVar4 = curl_easy_strerror(iVar3);
              curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                            ,0x51,iVar3,uVar4);
              iVar2 = iVar3;
            }
            if (iVar2 == 0) {
              lVar6 = curl_multi_init();
              if (lVar6 == 0) {
                curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                              ,0x53);
                iVar2 = 0x7b;
              }
              else {
                iVar2 = curl_multi_add_handle(lVar6,lVar5);
                uVar1 = _stderr;
                if (iVar2 == 0) {
                  iVar2 = 0;
                }
                else {
                  uVar4 = curl_multi_strerror(iVar2);
                  curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                ,0x55,iVar2,uVar4);
                }
                if (iVar2 == 0) {
                  iVar2 = 0;
                  do {
                    local_1d8 = -99;
                    local_1e0 = -99;
                    iVar3 = curl_multi_perform(lVar6,&local_1dc);
                    uVar1 = _stderr;
                    if (iVar3 == 0) {
                      if (local_1dc < 0) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                      ,0x5f);
                        iVar2 = 0x7a;
                      }
                    }
                    else {
                      uVar4 = curl_multi_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                    ,0x5f,iVar3,uVar4);
                      iVar2 = iVar3;
                    }
                    iVar3 = 10;
                    if (iVar2 == 0) {
                      tVar10 = tutil_tvnow();
                      lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                      if (lVar7 < 0xea61) {
                        if (local_1dc == 0) {
                          iVar2 = 0;
                          iVar3 = 0x2b;
                        }
                        else {
                          local_1b8.__fds_bits[0xe] = 0;
                          local_1b8.__fds_bits[0xf] = 0;
                          local_1b8.__fds_bits[0xc] = 0;
                          local_1b8.__fds_bits[0xd] = 0;
                          local_1b8.__fds_bits[10] = 0;
                          local_1b8.__fds_bits[0xb] = 0;
                          local_1b8.__fds_bits[8] = 0;
                          local_1b8.__fds_bits[9] = 0;
                          local_1b8.__fds_bits[6] = 0;
                          local_1b8.__fds_bits[7] = 0;
                          local_1b8.__fds_bits[4] = 0;
                          local_1b8.__fds_bits[5] = 0;
                          local_1b8.__fds_bits[2] = 0;
                          local_1b8.__fds_bits[3] = 0;
                          local_1b8.__fds_bits[0] = 0;
                          local_1b8.__fds_bits[1] = 0;
                          local_b8.__fds_bits[0] = 0;
                          local_b8.__fds_bits[1] = 0;
                          local_b8.__fds_bits[2] = 0;
                          local_b8.__fds_bits[3] = 0;
                          local_b8.__fds_bits[4] = 0;
                          local_b8.__fds_bits[5] = 0;
                          local_b8.__fds_bits[6] = 0;
                          local_b8.__fds_bits[7] = 0;
                          local_b8.__fds_bits[8] = 0;
                          local_b8.__fds_bits[9] = 0;
                          local_b8.__fds_bits[10] = 0;
                          local_b8.__fds_bits[0xb] = 0;
                          local_b8.__fds_bits[0xc] = 0;
                          local_b8.__fds_bits[0xd] = 0;
                          local_b8.__fds_bits[0xe] = 0;
                          local_b8.__fds_bits[0xf] = 0;
                          local_138.__fds_bits[0] = 0;
                          local_138.__fds_bits[1] = 0;
                          local_138.__fds_bits[2] = 0;
                          local_138.__fds_bits[3] = 0;
                          local_138.__fds_bits[4] = 0;
                          local_138.__fds_bits[5] = 0;
                          local_138.__fds_bits[6] = 0;
                          local_138.__fds_bits[7] = 0;
                          local_138.__fds_bits[8] = 0;
                          local_138.__fds_bits[9] = 0;
                          local_138.__fds_bits[10] = 0;
                          local_138.__fds_bits[0xb] = 0;
                          local_138.__fds_bits[0xc] = 0;
                          local_138.__fds_bits[0xd] = 0;
                          local_138.__fds_bits[0xe] = 0;
                          local_138.__fds_bits[0xf] = 0;
                          iVar2 = curl_multi_fdset(lVar6,&local_1b8,&local_b8,&local_138,&local_1e0)
                          ;
                          uVar1 = _stderr;
                          if (iVar2 == 0) {
                            iVar2 = 0;
                            if (local_1e0 < -1) {
                              curl_mfprintf(_stderr,
                                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                            ,0x6a);
                              iVar2 = 0x7a;
                            }
                          }
                          else {
                            uVar4 = curl_multi_strerror(iVar2);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                          ,0x6a,iVar2,uVar4);
                          }
                          if (iVar2 == 0) {
                            iVar2 = curl_multi_timeout(lVar6,&local_1d8);
                            uVar1 = _stderr;
                            if (iVar2 == 0) {
                              iVar2 = 0;
                              if (local_1d8 < -1) {
                                curl_mfprintf(_stderr,
                                              "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                              ,0x6e);
                                iVar2 = 0x73;
                              }
                            }
                            else {
                              uVar4 = curl_multi_strerror(iVar2);
                              curl_mfprintf(uVar1,
                                            "%s:%d curl_multi_timeout() failed, with code %d (%s)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                            ,0x6e,iVar2,uVar4);
                            }
                            if (iVar2 == 0) {
                              if (local_1d8 == -1) {
                                local_1d0.tv_sec = 0;
                                local_1d0.tv_usec = 100000;
                              }
                              else {
                                lVar7 = local_1d8;
                                if (0x7ffffffe < local_1d8) {
                                  lVar7 = 0x7fffffff;
                                }
                                local_1d0.tv_sec = (__time_t)((int)lVar7 / 1000);
                                local_1d0.tv_usec = (__suseconds_t)(((int)lVar7 % 1000) * 1000);
                              }
                              iVar2 = select_wrapper(local_1e0 + 1,&local_1b8,&local_b8,&local_138,
                                                     &local_1d0);
                              if (iVar2 == -1) {
                                piVar8 = __errno_location();
                                iVar2 = *piVar8;
                                local_1c0 = _stderr;
                                pcVar9 = strerror(iVar2);
                                curl_mfprintf(local_1c0,
                                              "%s:%d select() failed, with errno %d (%s)\n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                              ,0x7c,iVar2,pcVar9);
                                iVar2 = 0x79;
                              }
                              else {
                                tVar10 = tutil_tvnow();
                                lVar7 = tutil_tvdiff(tVar10,tv_test_start);
                                iVar3 = 0;
                                iVar2 = 0;
                                if (60000 < lVar7) {
                                  curl_mfprintf(_stderr,
                                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                                ,
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                                ,0x7e);
                                  iVar2 = 0x7d;
                                  iVar3 = 10;
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        curl_mfprintf(_stderr,
                                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib591.c"
                                      ,0x61);
                        iVar2 = 0x7d;
                      }
                    }
                  } while (iVar3 == 0);
                  if (iVar3 != 10) {
                    if (iVar3 != 0x2b) goto LAB_001024c1;
                    lVar7 = curl_multi_info_read(lVar6,&local_1b8);
                    if (lVar7 != 0) {
                      iVar2 = *(int *)(lVar7 + 0x10);
                    }
                  }
                }
              }
              goto LAB_001024a4;
            }
          }
        }
      }
      lVar6 = 0;
    }
LAB_001024a4:
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar5);
    curl_global_cleanup();
  }
  fclose(__stream);
LAB_001024c1:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *easy = NULL;
  CURLM *multi = NULL;
  int res = 0;
  int running;
  int msgs_left;
  CURLMsg *msg;
  FILE *upload = NULL;

  start_test_timing();

  upload = fopen(libtest_arg3, "rb");
  if(!upload) {
    fprintf(stderr, "fopen() failed with error: %d (%s)\n",
            errno, strerror(errno));
    fprintf(stderr, "Error opening file: (%s)\n", libtest_arg3);
    return TEST_ERR_FOPEN;
  }

  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    fclose(upload);
    return res;
  }

  easy_init(easy);

  /* go verbose */
  easy_setopt(easy, CURLOPT_VERBOSE, 1L);

  /* specify target */
  easy_setopt(easy, CURLOPT_URL, URL);

  /* enable uploading */
  easy_setopt(easy, CURLOPT_UPLOAD, 1L);

  /* data pointer for the file read function */
  easy_setopt(easy, CURLOPT_READDATA, upload);

  /* use active mode FTP */
  easy_setopt(easy, CURLOPT_FTPPORT, "-");

  /* server connection timeout */
  easy_setopt(easy, CURLOPT_ACCEPTTIMEOUT_MS,
              strtol(libtest_arg2, NULL, 10)*1000);

  multi_init(multi);

  multi_add_handle(multi, easy);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    int maxfd = -99;

    multi_perform(multi, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    if(timeout != -1L) {
      int itimeout = (timeout > (long)INT_MAX) ? INT_MAX : (int)timeout;
      interval.tv_sec = itimeout/1000;
      interval.tv_usec = (itimeout%1000)*1000;
    }
    else {
      interval.tv_sec = 0;
      interval.tv_usec = 100000L; /* 100 ms */
    }

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &msgs_left);
  if(msg)
    res = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(easy);
  curl_global_cleanup();

  /* close the local file */
  fclose(upload);

  return res;
}